

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_midi_base.cpp
# Opt level: O0

void I_BuildMIDIMenuList(FOptionValues *opt)

{
  FOptionValues *opt_local;
  
  AddDefaultMidiDevices(opt);
  return;
}

Assistant:

void I_BuildMIDIMenuList (FOptionValues *opt)
{
	AddDefaultMidiDevices(opt);
}